

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

Vec_Str_t *
Cec_ManSatSolveSeq(Vec_Ptr_t *vPatts,Gia_Man_t *pAig,Cec_ParSat_t *pPars,int nRegs,int *pnPats)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Cec_ManSat_t *p;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Bar_Progress_t *p_00;
  Vec_Int_t *pVVar7;
  void **ppvVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int nItemsTotal;
  long lVar15;
  size_t sVar16;
  timespec ts;
  int local_74;
  int local_60;
  timespec local_58;
  Cec_ParSat_t *local_48;
  int *local_40;
  Gia_Obj_t *local_38;
  
  iVar3 = clock_gettime(3,&local_58);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    local_60 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8) >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),0xc) >> 0x1f)) +
               (int)local_58.tv_sec * -1000000;
  }
  if (vPatts->nSize < 2) {
LAB_005b6e68:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar3 = *(int *)(vPatts->pArray + 1);
  iVar10 = *(int *)vPatts->pArray;
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  p = Cec_ManSatCreate(pAig,pPars);
  nItemsTotal = pAig->vCos->nSize - pAig->nRegs;
  pVVar5 = (Vec_Str_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nItemsTotal - 1U) {
    iVar4 = nItemsTotal;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)malloc((long)iVar4);
  }
  pVVar5->pArray = pcVar6;
  p_00 = Bar_ProgressStart(_stdout,nItemsTotal);
  pVVar7 = pAig->vCos;
  if (pVVar7->nSize < 1) {
    iVar3 = -1;
  }
  else {
    iVar10 = (iVar3 - iVar10 & 0x1ffffffcU) << 3;
    lVar13 = 0;
    iVar3 = 0;
    local_74 = iVar10;
    local_48 = pPars;
    local_40 = pnPats;
    do {
      iVar4 = pVVar7->pArray[lVar13];
      if (((long)iVar4 < 0) || (pAig->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pAig->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if ((p_00 == (Bar_Progress_t *)0x0) || (p_00->nItemsNext <= lVar13)) {
        Bar_ProgressUpdate_int(p_00,(int)lVar13,"SAT...");
      }
      pGVar2 = pGVar2 + iVar4;
      uVar12 = (uint)*(undefined8 *)pGVar2;
      if ((~*(ulong *)(pGVar2 + -(ulong)(uVar12 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
        uVar1 = pVVar5->nSize;
        if ((uVar12 >> 0x1d & 1) == 0) {
          if (uVar1 == pVVar5->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = 0x10;
            }
            else {
              sVar16 = (ulong)uVar1 * 2;
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar16);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,sVar16);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = (int)sVar16;
            }
          }
          else {
            pcVar6 = pVVar5->pArray;
          }
          pVVar5->nSize = uVar1 + 1;
          pcVar6[(int)uVar1] = '\x01';
        }
        else {
          if (uVar1 == pVVar5->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = 0x10;
            }
            else {
              sVar16 = (ulong)uVar1 * 2;
              if (pVVar5->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar16);
              }
              else {
                pcVar6 = (char *)realloc(pVVar5->pArray,sVar16);
              }
              pVVar5->pArray = pcVar6;
              pVVar5->nCap = (int)sVar16;
            }
          }
          else {
            pcVar6 = pVVar5->pArray;
          }
          pVVar5->nSize = uVar1 + 1;
          pcVar6[(int)uVar1] = '\0';
        }
      }
      else {
        local_38 = pGVar2;
        iVar4 = Cec_ManSatCheckNode(p,(Gia_Obj_t *)
                                      ((ulong)(uVar12 >> 0x1d & 1) ^
                                      (ulong)(pGVar2 + -(ulong)(uVar12 & 0x1fffffff))));
        uVar12 = pVVar5->nSize;
        if (uVar12 == pVVar5->nCap) {
          if ((int)uVar12 < 0x10) {
            if (pVVar5->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
            }
            pVVar5->pArray = pcVar6;
            pVVar5->nCap = 0x10;
          }
          else {
            sVar16 = (ulong)uVar12 * 2;
            if (pVVar5->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar16);
            }
            else {
              pcVar6 = (char *)realloc(pVVar5->pArray,sVar16);
            }
            pVVar5->pArray = pcVar6;
            pVVar5->nCap = (int)sVar16;
          }
        }
        else {
          pcVar6 = pVVar5->pArray;
        }
        pVVar5->nSize = uVar12 + 1;
        pcVar6[(int)uVar12] = (char)iVar4;
        if (iVar4 == 0) {
          if (iVar3 == local_74) {
            lVar14 = (long)vPatts->nSize;
            if (lVar14 < 2) goto LAB_005b6e68;
            iVar4 = (int)((ulong)((long)vPatts->pArray[1] - (long)*vPatts->pArray) >> 2);
            lVar15 = (long)(iVar4 * 2);
            ppvVar8 = (void **)malloc((lVar15 * 4 + 8) * lVar14);
            lVar9 = lVar14 * 8;
            lVar11 = 0;
            do {
              ppvVar8[lVar11] = (void *)(lVar9 + (long)ppvVar8);
              lVar11 = lVar11 + 1;
              lVar9 = lVar9 + lVar15 * 4;
            } while (lVar14 != lVar11);
            sVar16 = (size_t)(iVar4 << 2);
            lVar9 = 0;
            do {
              if (lVar14 == lVar9) goto LAB_005b6e68;
              memcpy(ppvVar8[lVar9],vPatts->pArray[lVar9],sVar16);
              lVar9 = lVar9 + 1;
              iVar4 = vPatts->nSize;
            } while (lVar9 < iVar4);
            if (vPatts->pArray != (void **)0x0) {
              free(vPatts->pArray);
              iVar4 = vPatts->nSize;
            }
            vPatts->pArray = ppvVar8;
            if (iVar4 < 1) goto LAB_005b6e68;
            lVar14 = 0;
            do {
              memset((void *)((long)vPatts->pArray[lVar14] + sVar16),0,sVar16);
              lVar14 = lVar14 + 1;
            } while (lVar14 < vPatts->nSize);
            if (vPatts->nSize < 2) goto LAB_005b6e68;
            local_74 = (*(int *)(vPatts->pArray + 1) - *(int *)vPatts->pArray & 0x1ffffffcU) << 3;
          }
          iVar4 = iVar3 + (uint)(iVar3 % iVar10 == 0);
          Gia_ManIncrementTravId(pAig);
          iVar3 = iVar4 + 1;
          Cec_ManSatSolveSeq_rec
                    (p,pAig,local_38 + -(ulong)((uint)*(undefined8 *)local_38 & 0x1fffffff),vPatts,
                     iVar4,nRegs);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar7 = pAig->vCos;
    } while (lVar13 < pVVar7->nSize);
    iVar3 = iVar3 + -1;
    pPars = local_48;
    pnPats = local_40;
  }
  iVar10 = clock_gettime(3,&local_58);
  if (iVar10 < 0) {
    iVar10 = -1;
  }
  else {
    iVar10 = (int)(local_58.tv_nsec / 1000) + (int)local_58.tv_sec * 1000000;
  }
  p->timeTotal = iVar10 + local_60;
  Bar_ProgressStop(p_00);
  if (pPars->fVerbose != 0) {
    Cec_ManSatPrintStats(p);
  }
  Cec_ManSatStop(p);
  if (pnPats != (int *)0x0) {
    *pnPats = iVar3;
  }
  return pVVar5;
}

Assistant:

Vec_Str_t * Cec_ManSatSolveSeq( Vec_Ptr_t * vPatts, Gia_Man_t * pAig, Cec_ParSat_t * pPars, int nRegs, int * pnPats )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int iPat = 0, nPatsInit, nPats;
    int i, status;
    abctime clk = Abc_Clock();
    nPatsInit = nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    p = Cec_ManSatCreate( pAig, pPars );
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
//Abc_Print( 1, "output %d   status = %d\n", i, status );
        Vec_StrPush( vStatus, (char)status );
        if ( status != 0 )
            continue;
        // resize storage
        if ( iPat == nPats )
        {
            int nWords = Vec_PtrReadWordsSimInfo(vPatts);
            Vec_PtrReallocSimInfo( vPatts );
            Vec_PtrCleanSimInfo( vPatts, nWords, 2*nWords );
            nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
        }
        if ( iPat % nPatsInit == 0 )
            iPat++;
        // save the pattern
        Gia_ManIncrementTravId( pAig );
//        Vec_IntClear( p->vCex );
        Cec_ManSatSolveSeq_rec( p, pAig, Gia_ObjFanin0(pObj), vPatts, iPat++, nRegs );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
//        Cec_ManSatAddToStore( p->vCexStore, p->vCex );
//        if ( iPat == nPats )
//            break;
        // quit if one of them is solved
//        if ( pPars->fFirstStop )
//            break;
//        if ( iPat == 32 * 15 * 16 - 1 )
//            break;
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
    if ( pPars->fVerbose )
        Cec_ManSatPrintStats( p );
//    Abc_Print( 1, "Total number of cex literals = %d. (Ave = %d)\n", p->nCexLits, p->nCexLits/p->nSatSat );
    Cec_ManSatStop( p );
    if ( pnPats )
        *pnPats = iPat-1;
    return vStatus;
}